

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_list_view_end(nk_list_view *view)

{
  nk_panel *pnVar1;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx;
  nk_list_view *view_local;
  
  if (view == (nk_list_view *)0x0) {
    __assert_fail("view",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x56c4,"void nk_list_view_end(struct nk_list_view *)");
  }
  if (view->ctx == (nk_context *)0x0) {
    __assert_fail("view->ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x56c5,"void nk_list_view_end(struct nk_list_view *)");
  }
  if (view->scroll_pointer == (nk_uint *)0x0) {
    __assert_fail("view->scroll_pointer",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x56c6,"void nk_list_view_end(struct nk_list_view *)");
  }
  if ((view != (nk_list_view *)0x0) && (view->ctx != (nk_context *)0x0)) {
    pnVar1 = view->ctx->current->layout;
    pnVar1->at_y = (pnVar1->bounds).y + (float)view->total_height;
    *view->scroll_pointer = *view->scroll_pointer + view->scroll_value;
    nk_group_end(view->ctx);
  }
  return;
}

Assistant:

NK_API void
nk_list_view_end(struct nk_list_view *view)
{
    struct nk_context *ctx;
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(view);
    NK_ASSERT(view->ctx);
    NK_ASSERT(view->scroll_pointer);
    if (!view || !view->ctx) return;

    ctx = view->ctx;
    win = ctx->current;
    layout = win->layout;
    layout->at_y = layout->bounds.y + (float)view->total_height;
    *view->scroll_pointer = *view->scroll_pointer + view->scroll_value;
    nk_group_end(view->ctx);
}